

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O1

cupdlp_retcode
csr_alloc_matrix(CUPDLPcsr *csr,cupdlp_int nRows,cupdlp_int nCols,void *src,
                CUPDLP_MATRIX_FORMAT src_matrix_format)

{
  cupdlp_int *pcVar1;
  cupdlp_float *pcVar2;
  int iVar3;
  cupdlp_retcode cVar4;
  cupdlp_retcode cVar5;
  
  if ((src_matrix_format == CSC) || (src_matrix_format == CSR)) {
    iVar3 = *(int *)((long)src + 8);
  }
  else {
    iVar3 = 0;
    if (src_matrix_format == DENSE) {
      iVar3 = nCols * nRows;
    }
  }
  pcVar1 = (cupdlp_int *)calloc((long)(nRows + 1),4);
  csr->rowMatBeg = pcVar1;
  cVar5 = 1;
  if (pcVar1 != (cupdlp_int *)0x0) {
    pcVar1 = (cupdlp_int *)calloc((long)iVar3,4);
    csr->rowMatIdx = pcVar1;
    if (pcVar1 != (cupdlp_int *)0x0) {
      pcVar2 = (cupdlp_float *)calloc((long)iVar3,8);
      csr->rowMatElem = pcVar2;
      if (pcVar2 != (cupdlp_float *)0x0) {
        cVar4 = 0;
        cVar5 = cVar4;
        if (src_matrix_format == CSC) {
          csc2csr(csr,(CUPDLPcsc *)src);
        }
        else if (src_matrix_format == CSR) {
          csr_copy(csr,(CUPDLPcsr *)src);
        }
        else {
          cVar5 = 0;
          if (src_matrix_format == DENSE) {
            dense2csr(csr,(CUPDLPdense *)src);
            cVar5 = cVar4;
          }
        }
      }
    }
  }
  return cVar5;
}

Assistant:

cupdlp_retcode csr_alloc_matrix(CUPDLPcsr *csr, cupdlp_int nRows,
                                cupdlp_int nCols, void *src,
                                CUPDLP_MATRIX_FORMAT src_matrix_format) {
  cupdlp_retcode retcode = RETCODE_OK;
  cupdlp_int nnz = 0;
  switch (src_matrix_format) {
    case DENSE:
      nnz = nRows * nCols;
      break;
    case CSR:
      nnz = ((CUPDLPcsr *)src)->nMatElem;
      break;
    case CSC:
      nnz = ((CUPDLPcsc *)src)->nMatElem;
      break;
    default:
      break;
  }
  // todo make sure this is right
  cupdlp_init_zero_vec_int(csr->rowMatBeg, nRows + 1);
  cupdlp_init_zero_vec_int(csr->rowMatIdx, nnz);
  cupdlp_init_zero_vec_double(csr->rowMatElem, nnz);

  switch (src_matrix_format) {
    case DENSE:
      dense2csr(csr, (CUPDLPdense *)src);
      break;
    case CSR:
      csr_copy(csr, (CUPDLPcsr *)src);
      break;
    case CSC:
      csc2csr(csr, (CUPDLPcsc *)src);
      break;
    default:
      break;
  }
exit_cleanup:
  return retcode;
}